

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticClient.cpp
# Opt level: O0

void __thiscall
slang::DiagnosticClient::setEngine(DiagnosticClient *this,DiagnosticEngine *newEngine)

{
  runtime_error *this_00;
  SourceManager *pSVar1;
  long in_RSI;
  long in_RDI;
  
  if ((*(long *)(in_RDI + 8) != 0) && (*(long *)(in_RDI + 8) != in_RSI)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"Diagnostic client already has a different engine set");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  *(long *)(in_RDI + 8) = in_RSI;
  pSVar1 = DiagnosticEngine::getSourceManager(*(DiagnosticEngine **)(in_RDI + 8));
  *(SourceManager **)(in_RDI + 0x10) = pSVar1;
  return;
}

Assistant:

void DiagnosticClient::setEngine(const DiagnosticEngine& newEngine) {
    if (engine && engine != &newEngine)
        SLANG_THROW(std::runtime_error("Diagnostic client already has a different engine set"));

    engine = &newEngine;
    sourceManager = &engine->getSourceManager();
}